

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

char * mjs::op_text(token_type tt)

{
  runtime_error *this;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  token_type local_14;
  char *pcStack_10;
  token_type tt_local;
  
  switch(tt) {
  case rshiftshiftequal:
    pcStack_10 = ">>>=";
    break;
  case rshiftshift:
    pcStack_10 = ">>>";
    break;
  case lshiftequal:
    pcStack_10 = "<<=";
    break;
  case rshiftequal:
    pcStack_10 = ">>=";
    break;
  case equalequalequal:
    pcStack_10 = "===";
    break;
  case notequalequal:
    pcStack_10 = "!==";
    break;
  case equalequal:
    pcStack_10 = "==";
    break;
  case notequal:
    pcStack_10 = "!=";
    break;
  case ltequal:
    pcStack_10 = "<=";
    break;
  case gtequal:
    pcStack_10 = ">=";
    break;
  case andand:
    pcStack_10 = "&&";
    break;
  case oror:
    pcStack_10 = "||";
    break;
  case plusplus:
    pcStack_10 = "++";
    break;
  case minusminus:
    pcStack_10 = "--";
    break;
  case lshift:
    pcStack_10 = "<<";
    break;
  case rshift:
    pcStack_10 = ">>";
    break;
  case plusequal:
    pcStack_10 = "+=";
    break;
  case minusequal:
    pcStack_10 = "-=";
    break;
  case multiplyequal:
    pcStack_10 = "*=";
    break;
  case divideequal:
    pcStack_10 = "/=";
    break;
  case andequal:
    pcStack_10 = "&=";
    break;
  case orequal:
    pcStack_10 = "|=";
    break;
  case xorequal:
    pcStack_10 = "^=";
    break;
  case modequal:
    pcStack_10 = "%=";
    break;
  case equal:
    pcStack_10 = "=";
    break;
  case gt:
    pcStack_10 = ">";
    break;
  case lt:
    pcStack_10 = "<";
    break;
  case comma:
    pcStack_10 = ",";
    break;
  case not_:
    pcStack_10 = "!";
    break;
  case tilde:
    pcStack_10 = "~";
    break;
  case question:
    pcStack_10 = "?";
    break;
  case colon:
    pcStack_10 = ":";
    break;
  case dot:
    pcStack_10 = ".";
    break;
  case plus:
    pcStack_10 = "+";
    break;
  case minus:
    pcStack_10 = "-";
    break;
  case multiply:
    pcStack_10 = "*";
    break;
  case divide:
    pcStack_10 = "/";
    break;
  case and_:
    pcStack_10 = "&";
    break;
  case or_:
    pcStack_10 = "|";
    break;
  case xor_:
    pcStack_10 = "^";
    break;
  case mod:
    pcStack_10 = "%";
    break;
  case lparen:
    pcStack_10 = "(";
    break;
  case rparen:
    pcStack_10 = ")";
    break;
  case lbrace:
    pcStack_10 = "{";
    break;
  case rbrace:
    pcStack_10 = "}";
    break;
  case lbracket:
    pcStack_10 = "[";
    break;
  case rbracket:
    pcStack_10 = "]";
    break;
  case semicolon:
    pcStack_10 = ";";
    break;
  default:
    local_14 = tt;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_58,local_14);
    std::operator+(&local_38,"Invalid token type in op_text: ",&local_58);
    std::runtime_error::runtime_error(this,(string *)&local_38);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case in_:
    pcStack_10 = " in ";
    break;
  case instanceof_:
    pcStack_10 = " instanceof ";
  }
  return pcStack_10;
}

Assistant:

const char* op_text(token_type tt) {
    switch (tt) {
#define CASE_PUNCTUATOR(name, str, ...) case token_type::name: return str;
        MJS_PUNCTUATORS(CASE_PUNCTUATOR)
#undef CASE_PUNCTUATOR
    case token_type::in_: return " in ";
    case token_type::instanceof_: return " instanceof ";
    default:
        throw std::runtime_error("Invalid token type in op_text: " + std::to_string((int)tt));
    }
}